

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttreader.cc
# Opt level: O3

int __thiscall libwebvtt::VttReader::GetChar(VttReader *this,char *c)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  
  uVar2 = 0xffffffff;
  if ((c != (char *)0x0) && ((FILE *)this->file_ != (FILE *)0x0)) {
    iVar1 = fgetc((FILE *)this->file_);
    if (iVar1 == -1) {
      __stream = (FILE *)this->file_;
      iVar1 = ferror(__stream);
      if (iVar1 == 0) {
        iVar1 = feof(__stream);
        uVar2 = -(uint)(iVar1 == 0) | 1;
      }
    }
    else {
      *c = (char)iVar1;
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

int VttReader::GetChar(char* c) {
  if (c == NULL || file_ == NULL)
    return -1;

  const int result = fgetc(file_);
  if (result != EOF) {
    *c = static_cast<char>(result);
    return 0;  // success
  }

  if (ferror(file_))
    return -1;  // error

  if (feof(file_))
    return 1;  // EOF

  return -1;  // weird
}